

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

void Map_MappingMark_rec(Map_Node_t *pNode)

{
  int iVar1;
  Map_Node_t *pNode_local;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Map_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperUtils.c"
                  ,0xd1,"void Map_MappingMark_rec(Map_Node_t *)");
  }
  if ((*(uint *)&pNode->field_0x1c & 1) != 1) {
    *(uint *)&pNode->field_0x1c = *(uint *)&pNode->field_0x1c & 0xfffffffe | 1;
    iVar1 = Map_NodeIsAnd(pNode);
    if (iVar1 != 0) {
      Map_MappingMark_rec((Map_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe));
      Map_MappingMark_rec((Map_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe));
    }
  }
  return;
}

Assistant:

void Map_MappingMark_rec( Map_Node_t * pNode )
{
    assert( !Map_IsComplement(pNode) );
    if ( pNode->fMark0 == 1 )
        return;
    pNode->fMark0 = 1;
    if ( !Map_NodeIsAnd(pNode) )
        return;
    // visit the transitive fanin of the selected cut
    Map_MappingMark_rec( Map_Regular(pNode->p1) );
    Map_MappingMark_rec( Map_Regular(pNode->p2) );
}